

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::getSiteLogLikelihoods
          (BeagleCPUImpl<float,_1,_0> *this,double *outLogLikelihoods)

{
  uint *puVar1;
  double *pdVar2;
  float *pfVar3;
  uint uVar4;
  int *piVar5;
  float *pfVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  ulong uVar21;
  byte bVar22;
  byte bVar23;
  void *__ptr;
  ulong uVar24;
  ushort uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  
  if (this->kPatternsReordered == true) {
    uVar4 = this->kPatternCount;
    __ptr = malloc((long)(int)uVar4 * 4);
    if (0 < (long)(int)uVar4) {
      piVar5 = this->gPatternsNewOrder;
      pfVar6 = this->outLogLikelihoodsTmp;
      auVar28 = vpbroadcastq_avx512f();
      uVar24 = 0;
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar31 = vpbroadcastq_avx512f();
        auVar32 = vporq_avx512f(auVar31,auVar29);
        auVar31 = vporq_avx512f(auVar31,auVar30);
        uVar20 = vpcmpuq_avx512f(auVar31,auVar28,2);
        bVar22 = (byte)uVar20;
        uVar20 = vpcmpuq_avx512f(auVar32,auVar28,2);
        bVar23 = (byte)uVar20;
        uVar25 = CONCAT11(bVar23,bVar22);
        vmovdqu32_avx512f(*(undefined1 (*) [64])(piVar5 + uVar24));
        auVar31 = vgatherdps_avx512f(pfVar6[(long)outLogLikelihoods]);
        puVar1 = (uint *)((long)__ptr + uVar24 * 4);
        bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar25 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar25 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar25 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar25 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar25 >> 6) & 1);
        bVar13 = (bool)((byte)(uVar25 >> 7) & 1);
        bVar14 = (bool)(bVar23 >> 1 & 1);
        bVar15 = (bool)(bVar23 >> 2 & 1);
        bVar16 = (bool)(bVar23 >> 3 & 1);
        bVar17 = (bool)(bVar23 >> 4 & 1);
        bVar18 = (bool)(bVar23 >> 5 & 1);
        bVar19 = (bool)(bVar23 >> 6 & 1);
        *puVar1 = (uint)(bVar22 & 1) * (uint)(bVar22 & 1) * auVar31._0_4_ |
                  (uint)!(bool)(bVar22 & 1) * *puVar1;
        puVar1[1] = (uint)bVar7 * (uint)((byte)(uVar25 >> 1) & 1) * auVar31._4_4_ |
                    (uint)!bVar7 * puVar1[1];
        puVar1[2] = (uint)bVar8 * (uint)((byte)(uVar25 >> 2) & 1) * auVar31._8_4_ |
                    (uint)!bVar8 * puVar1[2];
        puVar1[3] = (uint)bVar9 * (uint)((byte)(uVar25 >> 3) & 1) * auVar31._12_4_ |
                    (uint)!bVar9 * puVar1[3];
        puVar1[4] = (uint)bVar10 * (uint)((byte)(uVar25 >> 4) & 1) * auVar31._16_4_ |
                    (uint)!bVar10 * puVar1[4];
        puVar1[5] = (uint)bVar11 * (uint)((byte)(uVar25 >> 5) & 1) * auVar31._20_4_ |
                    (uint)!bVar11 * puVar1[5];
        puVar1[6] = (uint)bVar12 * (uint)((byte)(uVar25 >> 6) & 1) * auVar31._24_4_ |
                    (uint)!bVar12 * puVar1[6];
        puVar1[7] = (uint)bVar13 * (uint)((byte)(uVar25 >> 7) & 1) * auVar31._28_4_ |
                    (uint)!bVar13 * puVar1[7];
        puVar1[8] = (uint)(bVar23 & 1) * (uint)(bVar23 & 1) * auVar31._32_4_ |
                    (uint)!(bool)(bVar23 & 1) * puVar1[8];
        puVar1[9] = (uint)bVar14 * (uint)(bVar23 >> 1 & 1) * auVar31._36_4_ |
                    (uint)!bVar14 * puVar1[9];
        puVar1[10] = (uint)bVar15 * (uint)(bVar23 >> 2 & 1) * auVar31._40_4_ |
                     (uint)!bVar15 * puVar1[10];
        puVar1[0xb] = (uint)bVar16 * (uint)(bVar23 >> 3 & 1) * auVar31._44_4_ |
                      (uint)!bVar16 * puVar1[0xb];
        puVar1[0xc] = (uint)bVar17 * (uint)(bVar23 >> 4 & 1) * auVar31._48_4_ |
                      (uint)!bVar17 * puVar1[0xc];
        puVar1[0xd] = (uint)bVar18 * (uint)(bVar23 >> 5 & 1) * auVar31._52_4_ |
                      (uint)!bVar18 * puVar1[0xd];
        puVar1[0xe] = (uint)bVar19 * (uint)(bVar23 >> 6 & 1) * auVar31._56_4_ |
                      (uint)!bVar19 * puVar1[0xe];
        puVar1[0xf] = (uint)(bVar23 >> 7) * (uint)(bVar23 >> 7) * auVar31._60_4_ |
                      (uint)!(bool)(bVar23 >> 7) * puVar1[0xf];
        uVar24 = uVar24 + 0x10;
      } while ((uVar4 + 0xf & 0xfffffff0) != uVar24);
    }
    if ((ulong)uVar4 != 0) {
      auVar28 = vpbroadcastq_avx512f();
      uVar24 = 0;
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar30 = vpbroadcastq_avx512f();
        auVar30 = vporq_avx512f(auVar30,auVar29);
        uVar21 = vpcmpuq_avx512f(auVar30,auVar28,2);
        piVar5 = (int *)((long)__ptr + uVar24 * 4);
        auVar26._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * piVar5[1];
        auVar26._0_4_ = (uint)((byte)uVar21 & 1) * *piVar5;
        auVar26._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * piVar5[2];
        auVar26._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * piVar5[3];
        auVar26._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * piVar5[4];
        auVar26._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * piVar5[5];
        auVar26._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * piVar5[6];
        auVar26._28_4_ = (uint)(byte)(uVar21 >> 7) * piVar5[7];
        auVar30 = vcvtps2pd_avx512f(auVar26);
        pdVar2 = outLogLikelihoods + uVar24;
        bVar7 = (bool)((byte)uVar21 & 1);
        bVar8 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar21 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
        *pdVar2 = (double)((ulong)bVar7 * auVar30._0_8_ | (ulong)!bVar7 * (long)*pdVar2);
        pdVar2[1] = (double)((ulong)bVar8 * auVar30._8_8_ | (ulong)!bVar8 * (long)pdVar2[1]);
        pdVar2[2] = (double)((ulong)bVar9 * auVar30._16_8_ | (ulong)!bVar9 * (long)pdVar2[2]);
        pdVar2[3] = (double)((ulong)bVar10 * auVar30._24_8_ | (ulong)!bVar10 * (long)pdVar2[3]);
        pdVar2[4] = (double)((ulong)bVar11 * auVar30._32_8_ | (ulong)!bVar11 * (long)pdVar2[4]);
        pdVar2[5] = (double)((ulong)bVar12 * auVar30._40_8_ | (ulong)!bVar12 * (long)pdVar2[5]);
        pdVar2[6] = (double)((ulong)bVar13 * auVar30._48_8_ | (ulong)!bVar13 * (long)pdVar2[6]);
        pdVar2[7] = (double)((uVar21 >> 7) * auVar30._56_8_ |
                            (ulong)!SUB81(uVar21 >> 7,0) * (long)pdVar2[7]);
        uVar24 = uVar24 + 8;
      } while (((ulong)uVar4 + 7 & 0xfffffffffffffff8) != uVar24);
    }
    free(__ptr);
  }
  else {
    uVar4 = this->kPatternCount;
    if ((ulong)uVar4 != 0) {
      pfVar6 = this->outLogLikelihoodsTmp;
      auVar28 = vpbroadcastq_avx512f();
      uVar24 = 0;
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar30 = vpbroadcastq_avx512f();
        auVar30 = vporq_avx512f(auVar30,auVar29);
        uVar21 = vpcmpuq_avx512f(auVar30,auVar28,2);
        pfVar3 = pfVar6 + uVar24;
        auVar27._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * (int)pfVar3[1];
        auVar27._0_4_ = (uint)((byte)uVar21 & 1) * (int)*pfVar3;
        auVar27._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * (int)pfVar3[2];
        auVar27._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * (int)pfVar3[3];
        auVar27._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * (int)pfVar3[4];
        auVar27._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * (int)pfVar3[5];
        auVar27._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * (int)pfVar3[6];
        auVar27._28_4_ = (uint)(byte)(uVar21 >> 7) * (int)pfVar3[7];
        auVar30 = vcvtps2pd_avx512f(auVar27);
        pdVar2 = outLogLikelihoods + uVar24;
        bVar7 = (bool)((byte)uVar21 & 1);
        bVar8 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar21 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
        *pdVar2 = (double)((ulong)bVar7 * auVar30._0_8_ | (ulong)!bVar7 * (long)*pdVar2);
        pdVar2[1] = (double)((ulong)bVar8 * auVar30._8_8_ | (ulong)!bVar8 * (long)pdVar2[1]);
        pdVar2[2] = (double)((ulong)bVar9 * auVar30._16_8_ | (ulong)!bVar9 * (long)pdVar2[2]);
        pdVar2[3] = (double)((ulong)bVar10 * auVar30._24_8_ | (ulong)!bVar10 * (long)pdVar2[3]);
        pdVar2[4] = (double)((ulong)bVar11 * auVar30._32_8_ | (ulong)!bVar11 * (long)pdVar2[4]);
        pdVar2[5] = (double)((ulong)bVar12 * auVar30._40_8_ | (ulong)!bVar12 * (long)pdVar2[5]);
        pdVar2[6] = (double)((ulong)bVar13 * auVar30._48_8_ | (ulong)!bVar13 * (long)pdVar2[6]);
        pdVar2[7] = (double)((uVar21 >> 7) * auVar30._56_8_ |
                            (ulong)!SUB81(uVar21 >> 7,0) * (long)pdVar2[7]);
        uVar24 = uVar24 + 8;
      } while (((ulong)uVar4 + 7 & 0xfffffffffffffff8) != uVar24);
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getSiteLogLikelihoods(double* outLogLikelihoods) {
    if (kPatternsReordered) {
        REALTYPE* outLogLikelihoodsOriginalOrder = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount);
        for (int i=0; i < kPatternCount; i++) {
            outLogLikelihoodsOriginalOrder[i] = outLogLikelihoodsTmp[gPatternsNewOrder[i]];
        }
        beagleMemCpy(outLogLikelihoods, outLogLikelihoodsOriginalOrder, kPatternCount);
        free(outLogLikelihoodsOriginalOrder);
    } else {
        beagleMemCpy(outLogLikelihoods, outLogLikelihoodsTmp, kPatternCount);
    }

    return BEAGLE_SUCCESS;
}